

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

bool Covariance::Inverse<double>(double *A,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *A_00;
  int in_ESI;
  long in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  int j_1;
  int i_1;
  int j;
  int i;
  double det;
  double *B;
  int local_38;
  int local_34;
  int local_30;
  uint in_stack_ffffffffffffffd4;
  int j_00;
  double *in_stack_ffffffffffffffd8;
  bool local_1;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ESI * in_ESI);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  A_00 = (double *)operator_new__(uVar2);
  dVar3 = recurse_determinant<double>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  if (0.0 <= dVar3) {
    for (j_00 = 0; j_00 < in_ESI; j_00 = j_00 + 1) {
      for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
        dVar4 = pow(-1.0,(double)(j_00 + local_30 + 2));
        dVar5 = cofactor<double>(A_00,(int)((ulong)dVar3 >> 0x20),SUB84(dVar3,0),j_00);
        A_00[j_00 * in_ESI + local_30] = dVar4 * (dVar5 / dVar3);
      }
    }
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < in_ESI; local_38 = local_38 + 1) {
        *(double *)(in_RDI + (long)(local_34 * in_ESI + local_38) * 8) =
             A_00[local_34 * in_ESI + local_38];
      }
    }
    if (A_00 != (double *)0x0) {
      operator_delete__(A_00);
    }
    local_1 = true;
  }
  else {
    if (A_00 != (double *)0x0) {
      operator_delete__(A_00);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Inverse(T* A, int size) {
      T* B   = new T[size*size];
      T  det = recurse_determinant<T>(A, size);

      if(det < T(0.0)) {
         delete[] B;
         return false;
      }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            B[i*size + j] = pow(-1, i+j+2) * (cofactor<T>(A, size, j, i) / det);
         }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            A[i*size +j] = B[i*size + j];
         }

      delete[] B;
      return true;
   }